

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_xxmrghw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGTemp *ts_03;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  
  if (ctx->vsx_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)s);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)ts_01 - (long)s);
    ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_03 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(((ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8) * 0x10 +
                             0x12b28));
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(((ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8) * 0x10 +
                             0x12b28));
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_01,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b28)
                     );
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_02,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b28)
                     );
    tcg_gen_shri_i64_ppc64(s,ret,ret,0x20);
    tcg_gen_shri_i64_ppc64(s,ret_00,ret_00,0x20);
    tcg_gen_deposit_i64_ppc64(s,(TCGv_i64)((long)ts_03 - (long)s),ret_00,ret,0x20,0x20);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts_03,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28
                             ));
    tcg_gen_deposit_i64_ppc64
              (s,(TCGv_i64)((long)ts_03 - (long)s),(TCGv_i64)((long)ts_02 - (long)s),
               (TCGv_i64)((long)ts_00 - (long)s),0x20,0x20);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts_03,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b20
                             ));
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    tcg_temp_free_internal_ppc64(s,ts_01);
    tcg_temp_free_internal_ppc64(s,ts_02);
    tcg_temp_free_internal_ppc64(s,ts_03);
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xxsel(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = xT(ctx->opcode);
    int ra = xA(ctx->opcode);
    int rb = xB(ctx->opcode);
    int rc = xC(ctx->opcode);

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    tcg_gen_gvec_bitsel(tcg_ctx, MO_64, vsr_full_offset(rt), vsr_full_offset(rc),
                        vsr_full_offset(rb), vsr_full_offset(ra), 16, 16);
}